

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

int cram_index_build(cram_fd *fd,char *fn_base)

{
  int sz_00;
  size_t sVar1;
  cram_container *c_00;
  off_t oVar2;
  cram_block *pcVar3;
  cram_block_compression_hdr *pcVar4;
  off_t oVar5;
  cram_slice *s_00;
  off_t oVar6;
  int sz;
  cram_slice *s;
  char buf [1024];
  int local_104c;
  char local_1048 [4];
  int j;
  char fn_idx [4096];
  zfp *fp;
  off_t hpos;
  off_t spos;
  off_t cpos;
  cram_container *c;
  char *fn_base_local;
  cram_fd *fd_local;
  
  sVar1 = strlen(fn_base);
  if (sVar1 < 0xffb) {
    sprintf(local_1048,"%s.crai",fn_base);
    fn_idx._4088_8_ = zfopen(local_1048,"wz");
    if ((zfp *)fn_idx._4088_8_ == (zfp *)0x0) {
      perror(local_1048);
      fd_local._4_4_ = -1;
    }
    else {
      spos = htell(fd->fp);
      while (c_00 = cram_read_container(fd), c_00 != (cram_container *)0x0) {
        if (fd->err != 0) {
          perror("Cram container read");
          return 1;
        }
        oVar2 = htell(fd->fp);
        pcVar3 = cram_read_block(fd);
        c_00->comp_hdr_block = pcVar3;
        if (pcVar3 == (cram_block *)0x0) {
          return 1;
        }
        if (c_00->comp_hdr_block->content_type != COMPRESSION_HEADER) {
          __assert_fail("c->comp_hdr_block->content_type == COMPRESSION_HEADER",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                        ,0x1fd,"int cram_index_build(cram_fd *, const char *)");
        }
        pcVar4 = cram_decode_compression_header(fd,c_00->comp_hdr_block);
        c_00->comp_hdr = pcVar4;
        if (c_00->comp_hdr == (cram_block_compression_hdr *)0x0) {
          return -1;
        }
        for (local_104c = 0; local_104c < c_00->num_landmarks; local_104c = local_104c + 1) {
          oVar5 = htell(fd->fp);
          if ((oVar5 - spos) - c_00->offset != (long)c_00->landmark[local_104c]) {
            __assert_fail("spos - cpos - c->offset == c->landmark[j]",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                          ,0x20a,"int cram_index_build(cram_fd *, const char *)");
          }
          s_00 = cram_read_slice(fd);
          if (s_00 == (cram_slice *)0x0) {
            zfclose((zfp *)fn_idx._4088_8_);
            return -1;
          }
          oVar6 = htell(fd->fp);
          sz_00 = (int)oVar6 - (int)oVar5;
          if (s_00->hdr->ref_seq_id == -2) {
            cram_index_build_multiref
                      (fd,c_00,s_00,(zfp *)fn_idx._4088_8_,spos,c_00->landmark[local_104c],sz_00);
          }
          else {
            sprintf((char *)&s,"%d\t%d\t%d\t%ld\t%d\t%d\n",(ulong)(uint)s_00->hdr->ref_seq_id,
                    (ulong)(uint)s_00->hdr->ref_seq_start,(ulong)(uint)s_00->hdr->ref_seq_span,spos,
                    c_00->landmark[local_104c],sz_00);
            zfputs((char *)&s,(zfp *)fn_idx._4088_8_);
          }
          cram_free_slice(s_00);
        }
        spos = htell(fd->fp);
        if (spos != oVar2 + c_00->length) {
          __assert_fail("cpos == hpos + c->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_index.c"
                        ,0x222,"int cram_index_build(cram_fd *, const char *)");
        }
        cram_free_container(c_00);
      }
      if (fd->err == 0) {
        fd_local._4_4_ = zfclose((zfp *)fn_idx._4088_8_);
      }
      else {
        zfclose((zfp *)fn_idx._4088_8_);
        fd_local._4_4_ = -1;
      }
    }
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_index_build(cram_fd *fd, const char *fn_base) {
    cram_container *c;
    off_t cpos, spos, hpos;
    zfp *fp;
    char fn_idx[PATH_MAX];

    if (strlen(fn_base) > PATH_MAX-6)
	return -1;

    sprintf(fn_idx, "%s.crai", fn_base);
    if (!(fp = zfopen(fn_idx, "wz"))) {
        perror(fn_idx);
        return -1;
    }

    cpos = htell(fd->fp);
    while ((c = cram_read_container(fd))) {
        int j;

        if (fd->err) {
            perror("Cram container read");
            return 1;
        }

        hpos = htell(fd->fp);

        if (!(c->comp_hdr_block = cram_read_block(fd)))
            return 1;
        assert(c->comp_hdr_block->content_type == COMPRESSION_HEADER);

        c->comp_hdr = cram_decode_compression_header(fd, c->comp_hdr_block);
        if (!c->comp_hdr)
            return -1;

        // 2.0 format
        for (j = 0; j < c->num_landmarks; j++) {
            char buf[1024];
            cram_slice *s;
            int sz;

            spos = htell(fd->fp);
            assert(spos - cpos - c->offset == c->landmark[j]);

            if (!(s = cram_read_slice(fd))) {
		zfclose(fp);
		return -1;
	    }

            sz = (int)(htell(fd->fp) - spos);

	    if (s->hdr->ref_seq_id == -2) {
		cram_index_build_multiref(fd, c, s, fp,
					  cpos, c->landmark[j], sz);
	    } else {
		sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
			s->hdr->ref_seq_id, s->hdr->ref_seq_start,
			s->hdr->ref_seq_span, (int64_t)cpos,
			c->landmark[j], sz);
		zfputs(buf, fp);
	    }

            cram_free_slice(s);
        }

        cpos = htell(fd->fp);
        assert(cpos == hpos + c->length);

        cram_free_container(c);
    }
    if (fd->err) {
	zfclose(fp);
	return -1;
    }
	

    return zfclose(fp);
}